

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_concurrent.hpp
# Opt level: O0

void boost::unordered::detail::foa::
     concurrent_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
     ::delete_(allocator<boost::unordered::detail::foa::group_access> *param_1,undefined8 param_2)

{
  allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>
  *in_stack_ffffffffffffffd8;
  allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>
  local_12;
  allocator<boost::unordered::detail::foa::group_access> local_11;
  undefined8 local_10;
  allocator<boost::unordered::detail::foa::group_access> *local_8;
  
  local_10 = param_2;
  local_8 = param_1;
  std::allocator<boost::unordered::detail::foa::group_access>::
  allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>
            (param_1,in_stack_ffffffffffffffd8);
  delete_group_access(&local_11,local_10);
  std::allocator<boost::unordered::detail::foa::group_access>::~allocator(&local_11);
  std::
  allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>
  ::allocator((allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>
               *)param_1,in_stack_ffffffffffffffd8);
  table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::delete_(&local_12,local_10);
  std::
  allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>
  ::~allocator(&local_12);
  return;
}

Assistant:

static void delete_(allocator_type al, concurrent_table_arrays& arrays) noexcept {
        delete_group_access(group_access_allocator_type(al), arrays);
        super::delete_(al, arrays);
    }